

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O3

int Amap_LibCreateVar(Amap_Lib_t *p)

{
  Amap_Nod_t *pAVar1;
  
  if (p->pNodes == (Amap_Nod_t *)0x0) {
    p->nNodesAlloc = 0x100;
    pAVar1 = (Amap_Nod_t *)malloc(0x1800);
    p->pNodes = pAVar1;
    Amap_LibCreateObj(p);
    p->pNodes->field_0x3 = 2;
    p->pNodes->field_0x2 = 1;
    return 0;
  }
  __assert_fail("p->pNodes == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapUniq.c"
                ,0xa8,"int Amap_LibCreateVar(Amap_Lib_t *)");
}

Assistant:

int Amap_LibCreateVar( Amap_Lib_t * p )
{
    Amap_Nod_t * pNode;
    // start the manager
    assert( p->pNodes == NULL );
    p->nNodesAlloc = 256;
    p->pNodes = ABC_ALLOC( Amap_Nod_t, p->nNodesAlloc );
    // create the first node
    pNode = Amap_LibCreateObj( p );
    p->pNodes->Type = AMAP_OBJ_PI;
    p->pNodes->nSuppSize = 1;
    return 0;
}